

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTransitionMatrix
          (BeagleCPUImpl<float,_1,_0> *this,int matrixIndex,double *inMatrix,double paddedValue)

{
  double *in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  int j;
  int i;
  float *offsetBeagleMatrix;
  double *offsetInMatrix;
  int local_38;
  int local_34;
  float *local_30;
  double *local_28;
  
  local_30 = *(float **)(*(long *)(in_RDI + 0xd0) + (long)in_ESI * 8);
  local_28 = in_RDX;
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x24); local_38 = local_38 + 1) {
      beagleMemCpy<float,double_const>(local_30,local_28,*(uint *)(in_RDI + 0x24));
      local_30[*(int *)(in_RDI + 0x24)] = (float)in_XMM0_Qa;
      local_30 = local_30 + *(int *)(in_RDI + 0x28);
      local_28 = local_28 + *(int *)(in_RDI + 0x24);
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrix(int matrixIndex,
                                       const double* inMatrix,
                                       double paddedValue) {

if (T_PAD != 0) {
    const double* offsetInMatrix = inMatrix;
    REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
    for(int i = 0; i < kCategoryCount; i++) {
        for(int j = 0; j < kStateCount; j++) {
            beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
            offsetBeagleMatrix[kStateCount] = paddedValue;
            offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
            offsetInMatrix += kStateCount;
        }
    }
} else {
    beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                 kMatrixSize * kCategoryCount);
}
    return BEAGLE_SUCCESS;
}